

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

int ChunkCount(WebPDemuxer *dmux,char *fourcc)

{
  uint8_t *header;
  int count;
  Chunk *c;
  uint8_t *mem_buf;
  char *fourcc_local;
  WebPDemuxer *dmux_local;
  
  count = 0;
  for (c = dmux->chunks_; c != (Chunk *)0x0; c = c->next_) {
    if (*(int *)((dmux->mem_).buf_ + (c->data_).offset_) == *(int *)fourcc) {
      count = count + 1;
    }
  }
  return count;
}

Assistant:

static int ChunkCount(const WebPDemuxer* const dmux, const char fourcc[4]) {
  const uint8_t* const mem_buf = dmux->mem_.buf_;
  const Chunk* c;
  int count = 0;
  for (c = dmux->chunks_; c != NULL; c = c->next_) {
    const uint8_t* const header = mem_buf + c->data_.offset_;
    if (!memcmp(header, fourcc, TAG_SIZE)) ++count;
  }
  return count;
}